

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_buffer_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  undefined8 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  bool bVar5;
  undefined2 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Dim DVar9;
  bool bVar10;
  undefined1 uVar11;
  ImageFormat IVar12;
  AccessQualifier AVar13;
  TypeID TVar14;
  TypeID TVar15;
  uint32_t id;
  SPIRType *pSVar16;
  SPIRType *pSVar17;
  uint32_t id_00;
  Op local_38 [2];
  
  id_00 = this->argument_buffer_padding_buffer_type_id;
  if (id_00 == 0) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    local_38[1] = 0;
    pSVar16 = Compiler::set<spirv_cross::SPIRType,spv::Op>((Compiler *)this,id,local_38 + 1);
    pSVar16->basetype = rez_bind->basetype;
    pSVar16->storage = StorageClassUniformConstant;
    id_00 = id + 1;
    local_38[0] = OpTypePointer;
    pSVar17 = Compiler::set<spirv_cross::SPIRType,spv::Op>((Compiler *)this,id_00,local_38);
    (pSVar17->super_IVariant).self.id = (pSVar16->super_IVariant).self.id;
    uVar2 = pSVar16->width;
    uVar3 = pSVar16->vecsize;
    *(undefined8 *)&(pSVar17->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar16->super_IVariant).field_0xc;
    pSVar17->width = uVar2;
    pSVar17->vecsize = uVar3;
    pSVar17->columns = pSVar16->columns;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar17->array,&pSVar16->array);
    SmallVector<bool,_8UL>::operator=(&pSVar17->array_size_literal,&pSVar16->array_size_literal);
    bVar4 = pSVar16->pointer;
    bVar5 = pSVar16->forward_pointer;
    uVar6 = *(undefined2 *)&pSVar16->field_0x7e;
    uVar2 = (pSVar16->cooperative).use_id;
    uVar3 = (pSVar16->cooperative).rows_id;
    uVar7 = (pSVar16->cooperative).rows_id;
    uVar8 = (pSVar16->cooperative).columns_id;
    uVar1 = *(undefined8 *)&(pSVar16->cooperative).scope_id;
    pSVar17->pointer_depth = pSVar16->pointer_depth;
    pSVar17->pointer = bVar4;
    pSVar17->forward_pointer = bVar5;
    *(undefined2 *)&pSVar17->field_0x7e = uVar6;
    (pSVar17->cooperative).use_id = uVar2;
    (pSVar17->cooperative).rows_id = uVar3;
    (pSVar17->cooperative).rows_id = uVar7;
    (pSVar17->cooperative).columns_id = uVar8;
    *(undefined8 *)&(pSVar17->cooperative).scope_id = uVar1;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar17->member_types,&pSVar16->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar17->member_type_index_redirection,&pSVar16->member_type_index_redirection);
    DVar9 = (pSVar16->image).dim;
    bVar4 = (pSVar16->image).depth;
    bVar5 = (pSVar16->image).arrayed;
    bVar10 = (pSVar16->image).ms;
    uVar11 = (pSVar16->image).field_0xb;
    uVar2 = (pSVar16->image).sampled;
    IVar12 = (pSVar16->image).format;
    AVar13 = (pSVar16->image).access;
    TVar14.id = (pSVar16->type_alias).id;
    TVar15.id = (pSVar16->parent_type).id;
    (pSVar17->image).type = (TypeID)(pSVar16->image).type.id;
    (pSVar17->image).dim = DVar9;
    (pSVar17->image).depth = bVar4;
    (pSVar17->image).arrayed = bVar5;
    (pSVar17->image).ms = bVar10;
    (pSVar17->image).field_0xb = uVar11;
    (pSVar17->image).sampled = uVar2;
    (pSVar17->image).format = IVar12;
    (pSVar17->image).access = AVar13;
    pSVar17->type_alias = (TypeID)TVar14.id;
    pSVar17->parent_type = (TypeID)TVar15.id;
    if (pSVar16 != pSVar17) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar17->member_name_cache,&(pSVar16->member_name_cache)._M_h);
    }
    *(undefined4 *)&(pSVar17->super_IVariant).field_0xc = 0x20;
    pSVar17->pointer = true;
    pSVar17->pointer_depth = pSVar17->pointer_depth + 1;
    (pSVar17->parent_type).id = id;
    this->argument_buffer_padding_buffer_type_id = id_00;
  }
  add_argument_buffer_padding_type(this,id_00,struct_type,mbr_idx,arg_buff_index,rez_bind->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_buffer_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                          uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_buffer_type_id)
	{
		uint32_t buff_type_id = ir.increase_bound_by(2);
		auto &buff_type = set<SPIRType>(buff_type_id, OpNop);
		buff_type.basetype = rez_bind.basetype;
		buff_type.storage = StorageClassUniformConstant;

		uint32_t ptr_type_id = buff_type_id + 1;
		auto &ptr_type = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_type = buff_type;
		ptr_type.op = spv::OpTypePointer;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = buff_type_id;

		argument_buffer_padding_buffer_type_id = ptr_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_buffer_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}